

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall CLI::App::_process_requirements(App *this)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  ExcludesError *pEVar4;
  pointer pOVar5;
  ArgumentMismatch *__return_storage_ptr__;
  RequiresError *this_00;
  reference ppOVar6;
  size_type sVar7;
  RequiredError *pRVar8;
  element_type *peVar9;
  ulong uVar10;
  string local_3d0;
  __shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_3b0;
  App_p *sub_1;
  iterator __end2_4;
  iterator __begin2_4;
  vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_> *__range2_4;
  string local_388 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  anon_class_1_0_00000001 local_319;
  function<bool_(CLI::App_*)> local_318;
  undefined1 local_2f8 [8];
  vector<CLI::App_*,_std::allocator<CLI::App_*>_> subc_list;
  string local_2d8 [40];
  undefined1 local_2b0 [8];
  string option_list;
  App_p *sub;
  iterator __end2_3;
  iterator __begin2_3;
  vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_> *__range2_3;
  vector<CLI::App_*,_std::allocator<CLI::App_*>_> selected_subcommands;
  string local_250;
  string local_230;
  Option *local_210;
  Option *opt_ex;
  iterator __end3_1;
  iterator __begin3_1;
  set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_> *__range3_1;
  string local_1e8;
  string local_1c8;
  Option *local_1a8;
  Option *opt_req;
  iterator __end3;
  iterator __begin3;
  set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_> *__range3;
  string local_180;
  undefined1 local_159;
  string local_158;
  reference local_138;
  Option_p *opt_1;
  iterator __end2_2;
  iterator __begin2_2;
  vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
  *__range2_2;
  size_t used_options;
  string local_108;
  string local_e8;
  string local_c8;
  reference local_a8;
  App **subc;
  iterator __end2_1;
  iterator __begin2_1;
  set<CLI::App_*,_std::less<CLI::App_*>,_std::allocator<CLI::App_*>_> *__range2_1;
  string local_78;
  reference local_58;
  Option **opt;
  iterator __end2;
  iterator __begin2;
  set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_> *__range2;
  string excluder;
  bool excluded;
  App *this_local;
  
  excluder.field_2._M_local_buf[0xf] = '\0';
  ::std::__cxx11::string::string((string *)&__range2);
  __end2 = std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>::begin
                     (&this->exclude_options_);
  opt = (Option **)
        std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>::end
                  (&this->exclude_options_);
  while (bVar1 = std::operator!=(&__end2,(_Self *)&opt), bVar1) {
    local_58 = std::_Rb_tree_const_iterator<CLI::Option_*>::operator*(&__end2);
    sVar3 = Option::count(*local_58);
    if (sVar3 != 0) {
      excluder.field_2._M_local_buf[0xf] = '\x01';
      Option::get_name_abi_cxx11_(&local_78,*local_58,false,false);
      ::std::__cxx11::string::operator=((string *)&__range2,(string *)&local_78);
      ::std::__cxx11::string::~string((string *)&local_78);
    }
    std::_Rb_tree_const_iterator<CLI::Option_*>::operator++(&__end2);
  }
  __end2_1 = std::set<CLI::App_*,_std::less<CLI::App_*>,_std::allocator<CLI::App_*>_>::begin
                       (&this->exclude_subcommands_);
  subc = (App **)std::set<CLI::App_*,_std::less<CLI::App_*>,_std::allocator<CLI::App_*>_>::end
                           (&this->exclude_subcommands_);
  while (bVar1 = std::operator!=(&__end2_1,(_Self *)&subc), bVar1) {
    local_a8 = std::_Rb_tree_const_iterator<CLI::App_*>::operator*(&__end2_1);
    sVar3 = count_all(*local_a8);
    if (sVar3 != 0) {
      excluder.field_2._M_local_buf[0xf] = '\x01';
      get_display_name_abi_cxx11_(&local_c8,*local_a8);
      ::std::__cxx11::string::operator=((string *)&__range2,(string *)&local_c8);
      ::std::__cxx11::string::~string((string *)&local_c8);
    }
    std::_Rb_tree_const_iterator<CLI::App_*>::operator++(&__end2_1);
  }
  if ((excluder.field_2._M_local_buf[0xf] & 1U) == 0) {
    __range2_2 = (vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                  *)0x0;
    __end2_2 = std::
               vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
               ::begin(&this->options_);
    opt_1 = (Option_p *)
            std::
            vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
            ::end(&this->options_);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_2,
                              (__normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
                               *)&opt_1), bVar1) {
      local_138 = __gnu_cxx::
                  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
                  ::operator*(&__end2_2);
      pOVar5 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                         (local_138);
      sVar3 = Option::count(pOVar5);
      if (sVar3 != 0) {
        __range2_2 = (vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                      *)((long)&(__range2_2->
                                super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + 1);
      }
      pOVar5 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                         (local_138);
      bVar1 = OptionBase<CLI::Option>::get_required(&pOVar5->super_OptionBase<CLI::Option>);
      if (bVar1) {
LAB_001ac162:
        pOVar5 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                           (local_138);
        iVar2 = Option::get_items_expected(pOVar5);
        if (iVar2 < 0) {
          pOVar5 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                             (local_138);
          sVar3 = Option::count(pOVar5);
          pOVar5 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                             (local_138);
          iVar2 = Option::get_items_expected(pOVar5);
          if (sVar3 < (ulong)(long)-iVar2) {
            local_159 = 1;
            __return_storage_ptr__ = (ArgumentMismatch *)__cxa_allocate_exception(0x38);
            pOVar5 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                               (local_138);
            Option::get_name_abi_cxx11_(&local_158,pOVar5,false,false);
            pOVar5 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                               (local_138);
            iVar2 = Option::get_items_expected(pOVar5);
            ArgumentMismatch::AtLeast(__return_storage_ptr__,&local_158,-iVar2);
            local_159 = 0;
            __cxa_throw(__return_storage_ptr__,&ArgumentMismatch::typeinfo,
                        ArgumentMismatch::~ArgumentMismatch);
          }
        }
        pOVar5 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                           (local_138);
        bVar1 = OptionBase<CLI::Option>::get_required(&pOVar5->super_OptionBase<CLI::Option>);
        if (bVar1) {
          pOVar5 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                             (local_138);
          sVar3 = Option::count(pOVar5);
          if (sVar3 == 0) {
            pRVar8 = (RequiredError *)__cxa_allocate_exception(0x38);
            pOVar5 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                               (local_138);
            Option::get_name_abi_cxx11_(&local_180,pOVar5,false,false);
            RequiredError::RequiredError(pRVar8,&local_180);
            __cxa_throw(pRVar8,&RequiredError::typeinfo,RequiredError::~RequiredError);
          }
        }
      }
      else {
        pOVar5 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                           (local_138);
        sVar3 = Option::count(pOVar5);
        if (sVar3 != 0) goto LAB_001ac162;
      }
      pOVar5 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                         (local_138);
      __end3 = std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>::
               begin(&pOVar5->needs_);
      opt_req = (Option *)
                std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>::
                end(&pOVar5->needs_);
      while (bVar1 = std::operator!=(&__end3,(_Self *)&opt_req), bVar1) {
        ppOVar6 = std::_Rb_tree_const_iterator<CLI::Option_*>::operator*(&__end3);
        local_1a8 = *ppOVar6;
        pOVar5 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                           (local_138);
        sVar3 = Option::count(pOVar5);
        if ((sVar3 != 0) && (sVar3 = Option::count(local_1a8), sVar3 == 0)) {
          this_00 = (RequiresError *)__cxa_allocate_exception(0x38);
          pOVar5 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                             (local_138);
          Option::get_name_abi_cxx11_(&local_1c8,pOVar5,false,false);
          Option::get_name_abi_cxx11_(&local_1e8,local_1a8,false,false);
          RequiresError::RequiresError(this_00,&local_1c8,&local_1e8);
          __cxa_throw(this_00,&RequiresError::typeinfo,RequiresError::~RequiresError);
        }
        std::_Rb_tree_const_iterator<CLI::Option_*>::operator++(&__end3);
      }
      pOVar5 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                         (local_138);
      __end3_1 = std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>::
                 begin(&pOVar5->excludes_);
      opt_ex = (Option *)
               std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>::
               end(&pOVar5->excludes_);
      while (bVar1 = std::operator!=(&__end3_1,(_Self *)&opt_ex), bVar1) {
        ppOVar6 = std::_Rb_tree_const_iterator<CLI::Option_*>::operator*(&__end3_1);
        local_210 = *ppOVar6;
        pOVar5 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                           (local_138);
        sVar3 = Option::count(pOVar5);
        if ((sVar3 != 0) && (sVar3 = Option::count(local_210), sVar3 != 0)) {
          selected_subcommands.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
          pEVar4 = (ExcludesError *)__cxa_allocate_exception(0x38);
          pOVar5 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                             (local_138);
          Option::get_name_abi_cxx11_(&local_230,pOVar5,false,false);
          Option::get_name_abi_cxx11_(&local_250,local_210,false,false);
          ExcludesError::ExcludesError(pEVar4,&local_230,&local_250);
          selected_subcommands.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
          __cxa_throw(pEVar4,&ExcludesError::typeinfo,ExcludesError::~ExcludesError);
        }
        std::_Rb_tree_const_iterator<CLI::Option_*>::operator++(&__end3_1);
      }
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
      ::operator++(&__end2_2);
    }
    if (this->require_subcommand_min_ != 0) {
      get_subcommands((vector<CLI::App_*,_std::allocator<CLI::App_*>_> *)&__range2_3,this);
      uVar10 = this->require_subcommand_min_;
      sVar7 = std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::size
                        ((vector<CLI::App_*,_std::allocator<CLI::App_*>_> *)&__range2_3);
      if (sVar7 < uVar10) {
        pRVar8 = (RequiredError *)__cxa_allocate_exception(0x38);
        RequiredError::Subcommand(pRVar8,this->require_subcommand_min_);
        __cxa_throw(pRVar8,&RequiredError::typeinfo,RequiredError::~RequiredError);
      }
      std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::~vector
                ((vector<CLI::App_*,_std::allocator<CLI::App_*>_> *)&__range2_3);
    }
    __end2_3 = std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>::
               begin(&this->subcommands_);
    sub = (App_p *)std::
                   vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>::
                   end(&this->subcommands_);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_3,
                              (__normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
                               *)&sub), bVar1) {
      option_list.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
           ::operator*(&__end2_3);
      peVar9 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                          )option_list.field_2._8_8_);
      if ((peVar9->disabled_ & 1U) == 0) {
        std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   option_list.field_2._8_8_);
        uVar10 = ::std::__cxx11::string::empty();
        if ((uVar10 & 1) != 0) {
          peVar9 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)option_list.field_2._8_8_);
          sVar3 = count_all(peVar9);
          if (sVar3 != 0) {
            __range2_2 = (vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                          *)((long)&(__range2_2->
                                    super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + 1);
          }
        }
      }
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
      ::operator++(&__end2_3);
    }
    if ((__range2_2 <
         (vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
          *)this->require_option_min_) ||
       ((this->require_option_max_ != 0 &&
        ((vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
          *)this->require_option_max_ < __range2_2)))) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_2d8,",",
                 (allocator *)
                 ((long)&subc_list.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      detail::
      join<std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>,CLI::App::_process_requirements()::_lambda(std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const&)_1_,void>
                (local_2b0,(detail *)&this->options_,local_2d8);
      ::std::__cxx11::string::~string(local_2d8);
      ::std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&subc_list.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      iVar2 = ::std::__cxx11::string::compare((ulong)local_2b0,0,(char *)0xa);
      if (iVar2 == 0) {
        ::std::__cxx11::string::erase((ulong)local_2b0,0);
      }
      ::std::function<bool(CLI::App*)>::
      function<CLI::App::_process_requirements()::_lambda(CLI::App*)_1_,void>
                ((function<bool(CLI::App*)> *)&local_318,&local_319);
      get_subcommands((vector<CLI::App_*,_std::allocator<CLI::App_*>_> *)local_2f8,this,&local_318);
      std::function<bool_(CLI::App_*)>::~function(&local_318);
      bVar1 = std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::empty
                        ((vector<CLI::App_*,_std::allocator<CLI::App_*>_> *)local_2f8);
      if (!bVar1) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_388,",",(allocator *)((long)&__range2_4 + 7));
        detail::
        join<std::vector<CLI::App*,std::allocator<CLI::App*>>,CLI::App::_process_requirements()::_lambda(CLI::App_const*)_1_,void>
                  (&local_360,(detail *)local_2f8,local_388);
        ::std::operator+(&local_340,",",&local_360);
        ::std::__cxx11::string::operator+=((string *)local_2b0,(string *)&local_340);
        ::std::__cxx11::string::~string((string *)&local_340);
        ::std::__cxx11::string::~string((string *)&local_360);
        ::std::__cxx11::string::~string(local_388);
        ::std::allocator<char>::~allocator((allocator<char> *)((long)&__range2_4 + 7));
      }
      pRVar8 = (RequiredError *)__cxa_allocate_exception(0x38);
      RequiredError::Option
                (pRVar8,this->require_option_min_,this->require_option_max_,(size_t)__range2_2,
                 (string *)local_2b0);
      __cxa_throw(pRVar8,&RequiredError::typeinfo,RequiredError::~RequiredError);
    }
    __end2_4 = std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>::
               begin(&this->subcommands_);
    sub_1 = (App_p *)std::
                     vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                     ::end(&this->subcommands_);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_4,
                              (__normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
                               *)&sub_1), bVar1) {
      local_3b0 = (__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                  __gnu_cxx::
                  __normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
                  ::operator*(&__end2_4);
      peVar9 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(local_3b0);
      if ((peVar9->disabled_ & 1U) == 0) {
        std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  (local_3b0);
        uVar10 = ::std::__cxx11::string::empty();
        if (((uVar10 & 1) != 0) &&
           (peVar9 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->(local_3b0), (peVar9->required_ & 1U) == 0)) {
          peVar9 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->(local_3b0);
          sVar3 = count_all(peVar9);
          if ((sVar3 == 0) &&
             (((this->require_option_min_ != 0 &&
               ((vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                 *)this->require_option_min_ <= __range2_2)) ||
              ((this->require_option_max_ != 0 &&
               ((vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                 *)this->require_option_min_ <= __range2_2)))))) goto LAB_001acecc;
        }
        peVar9 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(local_3b0);
        sVar3 = count(peVar9);
        if (sVar3 == 0) {
          std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                    (local_3b0);
          uVar10 = ::std::__cxx11::string::empty();
          if ((uVar10 & 1) != 0) goto LAB_001acdbf;
        }
        else {
LAB_001acdbf:
          peVar9 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->(local_3b0);
          _process_requirements(peVar9);
        }
        peVar9 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(local_3b0);
        if ((peVar9->required_ & 1U) != 0) {
          peVar9 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->(local_3b0);
          sVar3 = count_all(peVar9);
          if (sVar3 == 0) {
            pRVar8 = (RequiredError *)__cxa_allocate_exception(0x38);
            peVar9 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->(local_3b0);
            get_display_name_abi_cxx11_(&local_3d0,peVar9);
            RequiredError::RequiredError(pRVar8,&local_3d0);
            __cxa_throw(pRVar8,&RequiredError::typeinfo,RequiredError::~RequiredError);
          }
        }
      }
LAB_001acecc:
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
      ::operator++(&__end2_4);
    }
  }
  else {
    sVar3 = count_all(this);
    if (sVar3 != 0) {
      pEVar4 = (ExcludesError *)__cxa_allocate_exception(0x38);
      get_display_name_abi_cxx11_(&local_e8,this);
      ::std::__cxx11::string::string((string *)&local_108,(string *)&__range2);
      ExcludesError::ExcludesError(pEVar4,&local_e8,&local_108);
      __cxa_throw(pEVar4,&ExcludesError::typeinfo,ExcludesError::~ExcludesError);
    }
  }
  ::std::__cxx11::string::~string((string *)&__range2);
  return;
}

Assistant:

void _process_requirements() {
        // check excludes
        bool excluded{false};
        std::string excluder;
        for(auto &opt : exclude_options_) {
            if(opt->count() > 0) {
                excluded = true;
                excluder = opt->get_name();
            }
        }
        for(auto &subc : exclude_subcommands_) {
            if(subc->count_all() > 0) {
                excluded = true;
                excluder = subc->get_display_name();
            }
        }
        if(excluded) {
            if(count_all() > 0) {
                throw ExcludesError(get_display_name(), excluder);
            }
            // if we are excluded but didn't receive anything, just return
            return;
        }
        size_t used_options = 0;
        for(const Option_p &opt : options_) {

            if(opt->count() != 0) {
                ++used_options;
            }
            // Required or partially filled
            if(opt->get_required() || opt->count() != 0) {
                // Make sure enough -N arguments parsed (+N is already handled in parsing function)
                if(opt->get_items_expected() < 0 && opt->count() < static_cast<size_t>(-opt->get_items_expected()))
                    throw ArgumentMismatch::AtLeast(opt->get_name(), -opt->get_items_expected());

                // Required but empty
                if(opt->get_required() && opt->count() == 0)
                    throw RequiredError(opt->get_name());
            }
            // Requires
            for(const Option *opt_req : opt->needs_)
                if(opt->count() > 0 && opt_req->count() == 0)
                    throw RequiresError(opt->get_name(), opt_req->get_name());
            // Excludes
            for(const Option *opt_ex : opt->excludes_)
                if(opt->count() > 0 && opt_ex->count() != 0)
                    throw ExcludesError(opt->get_name(), opt_ex->get_name());
        }
        // check for the required number of subcommands
        if(require_subcommand_min_ > 0) {
            auto selected_subcommands = get_subcommands();
            if(require_subcommand_min_ > selected_subcommands.size())
                throw RequiredError::Subcommand(require_subcommand_min_);
        }

        // Max error cannot occur, the extra subcommand will parse as an ExtrasError or a remaining item.

        // run this loop to check how many unnamed subcommands were actually used since they are considered options from
        // the perspective of an App
        for(App_p &sub : subcommands_) {
            if(sub->disabled_)
                continue;
            if(sub->name_.empty() && sub->count_all() > 0) {
                ++used_options;
            }
        }

        if(require_option_min_ > used_options || (require_option_max_ > 0 && require_option_max_ < used_options)) {
            auto option_list = detail::join(options_, [](const Option_p &ptr) { return ptr->get_name(false, true); });
            if(option_list.compare(0, 10, "-h,--help,") == 0) {
                option_list.erase(0, 10);
            }
            auto subc_list = get_subcommands([](App *app) { return ((app->get_name().empty()) && (!app->disabled_)); });
            if(!subc_list.empty()) {
                option_list += "," + detail::join(subc_list, [](const App *app) { return app->get_display_name(); });
            }
            throw RequiredError::Option(require_option_min_, require_option_max_, used_options, option_list);
        }

        // now process the requirements for subcommands if needed
        for(App_p &sub : subcommands_) {
            if(sub->disabled_)
                continue;
            if(sub->name_.empty() && sub->required_ == false) {
                if(sub->count_all() == 0) {
                    if(require_option_min_ > 0 && require_option_min_ <= used_options) {
                        continue;
                        // if we have met the requirement and there is nothing in this option group skip checking
                        // requirements
                    }
                    if(require_option_max_ > 0 && used_options >= require_option_min_) {
                        continue;
                        // if we have met the requirement and there is nothing in this option group skip checking
                        // requirements
                    }
                }
            }
            if(sub->count() > 0 || sub->name_.empty()) {
                sub->_process_requirements();
            }

            if(sub->required_ && sub->count_all() == 0) {
                throw(CLI::RequiredError(sub->get_display_name()));
            }
        }
    }